

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O1

int ebur128_init_filter(ebur128_state *st)

{
  uint uVar1;
  ebur128_state_internal *peVar2;
  size_t __size;
  filter_state *__s;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar4 = tan(5284.078578647628 /
              (((double)CONCAT44(0x45300000,(int)(st->samplerate >> 0x20)) - 1.9342813113834067e+25)
              + ((double)CONCAT44(0x43300000,(int)st->samplerate) - 4503599627370496.0)));
  dVar8 = dVar4 * dVar4;
  dVar6 = dVar4 / 0.7071752369554196 + 1.0 + dVar8;
  dVar5 = (dVar4 * 1.2587209302325617) / 0.7071752369554196;
  dVar10 = (dVar5 + 1.5848647011308556 + dVar8) / dVar6;
  dVar11 = (dVar8 + -1.5848647011308556 + dVar8 + -1.5848647011308556) / dVar6;
  dVar5 = ((1.5848647011308556 - dVar5) + dVar8) / dVar6;
  dVar9 = (dVar8 + -1.0 + dVar8 + -1.0) / dVar6;
  dVar6 = ((1.0 - dVar4 / 0.7071752369554196) + dVar8) / dVar6;
  dVar4 = tan(119.8061151453059 /
              (((double)CONCAT44(0x45300000,(int)(st->samplerate >> 0x20)) - 1.9342813113834067e+25)
              + ((double)CONCAT44(0x43300000,(int)st->samplerate) - 4503599627370496.0)));
  dVar8 = dVar4 * dVar4;
  dVar7 = dVar4 / 0.5003270373238773 + 1.0 + dVar8;
  dVar12 = (dVar8 + -1.0 + dVar8 + -1.0) / dVar7;
  dVar7 = ((1.0 - dVar4 / 0.5003270373238773) + dVar8) / dVar7;
  peVar2 = st->d;
  peVar2->b[0] = dVar10;
  peVar2->b[1] = dVar11 - (dVar10 + dVar10);
  peVar2->b[2] = (dVar10 - (dVar11 + dVar11)) + dVar5;
  peVar2->b[3] = dVar11 - (dVar5 + dVar5);
  peVar2->b[4] = dVar5;
  peVar2->a[0] = 1.0;
  peVar2->a[1] = dVar9 + dVar12;
  peVar2->a[2] = dVar9 * dVar12 + dVar7 + dVar6;
  peVar2->a[3] = dVar9 * dVar7 + dVar12 * dVar6;
  peVar2->a[4] = dVar7 * dVar6;
  uVar1 = st->channels;
  __size = (ulong)uVar1 * 0x28;
  __s = (filter_state *)malloc(__size);
  peVar2->v = __s;
  if (__s == (filter_state *)0x0) {
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    if (0 < (int)uVar1) {
      memset(__s,0,__size);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int ebur128_init_filter(ebur128_state* st) {
  int errcode = EBUR128_SUCCESS;
  int i, j;

  double f0 = 1681.974450955533;
  double G = 3.999843853973347;
  double Q = 0.7071752369554196;

  double K = tan(M_PI * f0 / (double) st->samplerate);
  double Vh = pow(10.0, G / 20.0);
  double Vb = pow(Vh, 0.4996667741545416);

  double pb[3] = { 0.0, 0.0, 0.0 };
  double pa[3] = { 1.0, 0.0, 0.0 };
  double rb[3] = { 1.0, -2.0, 1.0 };
  double ra[3] = { 1.0, 0.0, 0.0 };

  double a0 = 1.0 + K / Q + K * K;
  pb[0] = (Vh + Vb * K / Q + K * K) / a0;
  pb[1] = 2.0 * (K * K - Vh) / a0;
  pb[2] = (Vh - Vb * K / Q + K * K) / a0;
  pa[1] = 2.0 * (K * K - 1.0) / a0;
  pa[2] = (1.0 - K / Q + K * K) / a0;

  /* fprintf(stderr, "%.14f %.14f %.14f %.14f %.14f\n",
                     b1[0], b1[1], b1[2], a1[1], a1[2]); */

  f0 = 38.13547087602444;
  Q = 0.5003270373238773;
  K = tan(M_PI * f0 / (double) st->samplerate);

  ra[1] = 2.0 * (K * K - 1.0) / (1.0 + K / Q + K * K);
  ra[2] = (1.0 - K / Q + K * K) / (1.0 + K / Q + K * K);

  /* fprintf(stderr, "%.14f %.14f\n", a2[1], a2[2]); */

  st->d->b[0] = pb[0] * rb[0];
  st->d->b[1] = pb[0] * rb[1] + pb[1] * rb[0];
  st->d->b[2] = pb[0] * rb[2] + pb[1] * rb[1] + pb[2] * rb[0];
  st->d->b[3] = pb[1] * rb[2] + pb[2] * rb[1];
  st->d->b[4] = pb[2] * rb[2];

  st->d->a[0] = pa[0] * ra[0];
  st->d->a[1] = pa[0] * ra[1] + pa[1] * ra[0];
  st->d->a[2] = pa[0] * ra[2] + pa[1] * ra[1] + pa[2] * ra[0];
  st->d->a[3] = pa[1] * ra[2] + pa[2] * ra[1];
  st->d->a[4] = pa[2] * ra[2];

  st->d->v = (filter_state*) malloc(st->channels * sizeof(filter_state));
  CHECK_ERROR(!st->d->v, EBUR128_ERROR_NOMEM, exit);
  for (i = 0; i < (int) st->channels; ++i) {
    for (j = 0; j < FILTER_STATE_SIZE; ++j) {
      st->d->v[i][j] = 0.0;
    }
  }

exit:
  return errcode;
}